

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner.cc
# Opt level: O0

void __thiscall AwsCommandRunner::Remove(AwsCommandRunner *this,string *path)

{
  MultipleCommandRunner *pMVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d6;
  undefined1 local_1d5;
  allocator local_1d4;
  allocator local_1d3;
  allocator local_1d2;
  allocator local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  iterator local_128;
  size_type local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  undefined1 local_ff;
  allocator local_fe;
  allocator local_fd [20];
  allocator local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  iterator local_60;
  size_type local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  undefined1 local_38 [8];
  string full_url;
  string *path_local;
  AwsCommandRunner *this_local;
  
  full_url.field_2._8_8_ = path;
  GetFullUrl((string *)local_38,this,path);
  pMVar1 = this->command_runner_;
  local_ff = 1;
  local_e8 = &local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"aws",&local_e9);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"s3",local_fd);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"rm",&local_fe);
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::__cxx11::string::string((string *)local_e8,(string *)local_38);
  local_ff = 0;
  local_60 = &local_e0;
  local_58 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_100);
  __l_00._M_len = local_58;
  __l_00._M_array = local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,__l_00,&local_100);
  MultipleCommandRunner::RunCommand(pMVar1,&local_50,true);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_100);
  local_228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  do {
    local_228 = local_228 + -1;
    std::__cxx11::string::~string((string *)local_228);
  } while (local_228 != &local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fe);
  std::allocator<char>::~allocator((allocator<char> *)local_fd);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  pMVar1 = this->command_runner_;
  local_1d5 = 1;
  local_1d0 = &local_1c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,"aws",&local_1d1);
  local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"s3",&local_1d2);
  local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"rm",&local_1d3);
  local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"--recursive",&local_1d4);
  local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
  std::__cxx11::string::string((string *)local_1d0,(string *)local_38);
  local_1d5 = 0;
  local_128 = &local_1c8;
  local_120 = 5;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1d6);
  __l._M_len = local_120;
  __l._M_array = local_128;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_118,__l,&local_1d6);
  MultipleCommandRunner::RunCommand(pMVar1,&local_118,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1d6);
  local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128;
  do {
    local_290 = local_290 + -1;
    std::__cxx11::string::~string((string *)local_290);
  } while (local_290 != &local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d4);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d3);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d2);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void AwsCommandRunner::Remove(const std::string& path) {
  std::string full_url = GetFullUrl(path);
  command_runner_->RunCommand({"aws", "s3", "rm", full_url}, true);
  command_runner_->RunCommand({"aws", "s3", "rm", "--recursive", full_url},
                              false);
}